

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIOctreeTracer.cpp
# Opt level: O0

void UI::OctreeTracerMenuItems(shared_ptr<OctreeTracer> *octree_tracer)

{
  bool bVar1;
  element_type *peVar2;
  bool in_stack_000000be;
  bool in_stack_000000bf;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  bool *in_stack_00000130;
  char *in_stack_00000138;
  bool in_stack_00000147;
  char *in_stack_00000148;
  
  bVar1 = ImGui::BeginMenu(in_stack_00000148,in_stack_00000147);
  if (bVar1) {
    std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18a578);
    bVar1 = ImGui::MenuItem(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18a5aa);
      peVar2->m_view_type = kDiffuse;
    }
    std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18a5b9);
    bVar1 = ImGui::MenuItem(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18a5eb);
      peVar2->m_view_type = kNormal;
    }
    std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18a5fa);
    bVar1 = ImGui::MenuItem(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18a62c);
      peVar2->m_view_type = kPosition;
    }
    std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18a63b);
    bVar1 = ImGui::MenuItem(in_stack_000000c8,in_stack_000000c0,in_stack_000000bf,in_stack_000000be)
    ;
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18a66d);
      peVar2->m_view_type = kIteration;
    }
    ImGui::Separator();
    std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18a681);
    ImGui::Checkbox(in_stack_00000138,in_stack_00000130);
    ImGui::EndMenu();
  }
  return;
}

Assistant:

void OctreeTracerMenuItems(const std::shared_ptr<OctreeTracer> &octree_tracer) {
	if (ImGui::BeginMenu("View")) {
		if (ImGui::MenuItem("Diffuse", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kDiffuse))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kDiffuse;
		if (ImGui::MenuItem("Normal", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kNormal))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kNormal;
		if (ImGui::MenuItem("Position", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kPosition))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kPosition;
		if (ImGui::MenuItem("Iterations", nullptr, octree_tracer->m_view_type == OctreeTracer::ViewTypes::kIteration))
			octree_tracer->m_view_type = OctreeTracer::ViewTypes::kIteration;

		ImGui::Separator();

		ImGui::Checkbox("Beam Optimization", &octree_tracer->m_beam_enable);
		ImGui::EndMenu();
	}
}